

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<sdf_tools::real2&,float_const&>::load_impl_sequence<0ul,1ul>
          (void *param_1,handle param_2)

{
  handle src;
  bool bVar1;
  type_caster_generic *this;
  reference pvVar2;
  reference rVar3;
  undefined1 convert;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar4;
  _Bit_reference in_stack_ffffffffffffffb8;
  undefined1 convert_00;
  PyObject *this_00;
  
  convert = (undefined1)((ulong)param_1 >> 0x38);
  this = (type_caster_generic *)
         std::
         get<0ul,pybind11::detail::type_caster<sdf_tools::real2,void>,pybind11::detail::type_caster<float,void>>
                   ((tuple<pybind11::detail::type_caster<sdf_tools::real2,_void>,_pybind11::detail::type_caster<float,_void>_>
                     *)0x1a44bd);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &(param_2.m_ptr)->ob_type,0);
  this_00 = pvVar2->m_ptr;
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffb8._M_mask,
                     (size_type)in_stack_ffffffffffffffb8._M_p);
  convert_00 = rVar3._M_mask._7_1_;
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffd0);
  src.m_ptr._7_1_ = in_stack_ffffffffffffffb7;
  src.m_ptr._0_7_ = in_stack_ffffffffffffffb0;
  bVar1 = type_caster_generic::load(this,src,(bool)convert);
  bVar4 = 1;
  if (bVar1) {
    std::
    get<1ul,pybind11::detail::type_caster<sdf_tools::real2,void>,pybind11::detail::type_caster<float,void>>
              ((tuple<pybind11::detail::type_caster<sdf_tools::real2,_void>,_pybind11::detail::type_caster<float,_void>_>
                *)0x1a4530);
    std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
              ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
               &(param_2.m_ptr)->ob_type,1);
    std::vector<bool,_std::allocator<bool>_>::operator[]
              ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffb8._M_mask,
               (size_type)in_stack_ffffffffffffffb8._M_p);
    std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffb8);
    bVar1 = type_caster<float,_void>::load
                      ((type_caster<float,_void> *)this_00,param_2,(bool)convert_00);
    bVar4 = bVar1 ^ 0xff;
  }
  return (bVar4 & 1) == 0;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }